

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall fmt::print(fmt *this,FILE *f,CStringRef format_str,ArgList args)

{
  MemoryWriter w;
  BasicWriter<char> local_248;
  Buffer<char> local_238;
  char local_218 [504];
  
  local_248.buffer_ = &local_238;
  local_248._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00117cd0;
  local_238.size_ = 0;
  local_238.capacity_ = 500;
  local_238._vptr_Buffer = (_func_int **)&PTR_grow_00117d18;
  local_238.ptr_ = local_218;
  BasicWriter<char>::write(&local_248,(int)f,format_str.data_,args.types_);
  fwrite((local_248.buffer_)->ptr_,(local_248.buffer_)->size_,1,(FILE *)this);
  local_248._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00117cd0;
  local_238._vptr_Buffer = (_func_int **)&PTR_grow_00117d18;
  if (local_238.ptr_ != local_218) {
    operator_delete(local_238.ptr_,local_238.capacity_);
  }
  return;
}

Assistant:

FMT_FUNC void fmt::print(std::FILE *f, CStringRef format_str, ArgList args) {
  MemoryWriter w;
  w.write(format_str, args);
  std::fwrite(w.data(), w.size(), 1, f);
}